

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::HasItemQuery(CustomExternalWrapperObject *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  Var aValue;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  PropertyQueryFlags PVar6;
  Attributes attributes;
  HostScriptContext *pHVar7;
  JavascriptFunction *function;
  RecyclableObject *ptr;
  anon_class_48_6_c05621ac local_68;
  JavascriptBoolean *local_38;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = false;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  pHVar7 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar7->scriptContext;
  BVar5 = EnsureInitialized(this,pSVar2);
  if (BVar5 == 0) goto LAB_00a0fde3;
  aValue = *(Var *)&((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.
                    ptr)->elements[2].field_0x8;
  if (aValue != (Var)0x0) {
    function = VarTo<Js::JavascriptFunction>(aValue);
    if (function != (JavascriptFunction *)0x0) {
      bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar2);
      if (!bVar3) {
        local_38 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).booleanTrue.ptr;
        local_68.propertyNameNumericValue = JavascriptNumber::ToVar(index,pSVar2);
        local_68.propertyName = (Var)0x0;
        local_68.isPropertyNameNumeric = local_38;
        bVar3 = this_00->reentrancySafeOrHandled;
        this_00->reentrancySafeOrHandled = true;
        local_68.threadContext = this_00;
        local_68.hasMethod = function;
        local_68.targetObj = (RecyclableObject *)this;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
        bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
        if (bVar4) {
          ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
          bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00a0fe6b:
          if (bVar4 != false) {
            this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
            bVar4 = ThreadContext::IsOnStack(ptr);
            goto LAB_00a0fe6b;
          }
          IVar1 = this_00->implicitCallFlags;
          ptr = (RecyclableObject *)anon_func::anon_class_48_6_c05621ac::operator()(&local_68);
          this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
          ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                undefinedValue.ptr;
        }
        this_00->reentrancySafeOrHandled = bVar3;
        BVar5 = JavascriptConversion::ToBoolean(ptr,pSVar2);
        bVar3 = BVar5 != 0;
        goto LAB_00a0fde3;
      }
    }
  }
  PVar6 = DynamicObject::HasItemQuery(&this->super_DynamicObject,index);
  bVar3 = PVar6 == Property_Found;
LAB_00a0fde3:
  return (PropertyQueryFlags)bVar3;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::HasItemQuery(uint32 index)
{
    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index));
    };

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        *isPropertyNameNumeric = requestContext->GetLibrary()->GetTrue();
        *propertyNameNumericValue = JavascriptNumber::ToVar(index, requestContext);
        return nullptr;
    };

    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyName, nullptr));
}